

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_room_of_chambers(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t h;
  byte bVar1;
  _Bool _Var2;
  int16_t iVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  loc lVar10;
  square *psVar11;
  loc lVar12;
  loc grid;
  loc grid_00;
  wchar_t *pwVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  wchar_t wVar21;
  wchar_t wVar22;
  wchar_t y1;
  wchar_t x1;
  wchar_t wVar23;
  wchar_t x2;
  int iVar24;
  wchar_t wVar25;
  wchar_t wVar26;
  ulong uVar27;
  int iVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  int y;
  char *name_00;
  bool bVar31;
  char name [40];
  loc_conflict local_98;
  uint local_90;
  int local_8c;
  int local_88;
  uint local_84;
  uint32_t local_80;
  wchar_t local_7c;
  ulong local_78;
  ulong local_70;
  undefined8 local_68;
  undefined8 local_60;
  char local_58 [40];
  
  local_98 = centre;
  wVar4 = Rand_div(0x2d);
  local_7c = c->depth;
  iVar3 = m_bonus(0x14,local_7c);
  iVar28 = (int)iVar3;
  h = iVar28 + L'\x14';
  uVar5 = Rand_div(0x14);
  iVar3 = m_bonus(0x14,c->depth);
  wVar29 = uVar5 + (int)iVar3 + L'\x15';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,wVar29);
  if ((centre.y < c->height) && (wVar16 = centre.y, centre.x < c->width)) {
LAB_00157c08:
    y1 = wVar16 - h / 2;
    x1 = centre.x - wVar29 / 2;
    uVar27 = (ulong)(uint)x1;
    lVar10 = (loc)loc(x1,y1);
    _Var2 = square_in_bounds((chunk_conflict *)c,lVar10);
    if (_Var2) {
      wVar16 = wVar16 + ((iVar28 - (iVar28 + 0x13 >> 0x1f)) + 0x13 >> 1);
      iVar28 = (wVar29 - ((int)(uVar5 + (int)iVar3 + 0x14) >> 0x1f)) + -1 >> 1;
      x2 = centre.x + iVar28;
      lVar10 = (loc)loc(x2,wVar16);
      _Var2 = square_in_bounds((chunk_conflict *)c,lVar10);
      uVar17 = 0;
      if (_Var2) {
        uVar6 = wVar16 - y1;
        local_90 = -uVar6;
        if (0 < (int)uVar6) {
          local_90 = uVar6;
        }
        uVar7 = x2 - x1;
        uVar6 = -uVar7;
        if (0 < (int)uVar7) {
          uVar6 = uVar7;
        }
        local_70 = (ulong)((uVar6 * local_90) / 0x50 + 10);
        local_88 = wVar16 + L'\x01';
        local_8c = x2 + L'\x01';
        local_60 = 1;
        local_68 = 0;
        local_78 = (ulong)(uint)wVar29;
        do {
          local_84 = uVar17;
          uVar5 = Rand_div(4);
          uVar8 = Rand_div(10);
          iVar20 = uVar5 + uVar8 + 3;
          uVar8 = Rand_div(4);
          iVar24 = uVar8 + uVar5 + 3;
          uVar5 = Rand_div((local_88 - y1) - iVar24);
          wVar30 = uVar5 + y1;
          uVar8 = Rand_div((local_8c - x1) - iVar20);
          wVar15 = uVar8 + x1;
          wVar25 = iVar24 + wVar30;
          if (wVar16 <= wVar25) {
            wVar25 = wVar16;
          }
          wVar21 = iVar20 + wVar15;
          if (x2 <= wVar21) {
            wVar21 = x2;
          }
          fill_rectangle(c,uVar5 + 1 + y1,uVar8 + 1 + x1,wVar25 + L'\xffffffff',
                         wVar21 + L'\xffffffff',FEAT_MAGMA,L'\0');
          iVar20 = wVar25 - wVar30;
          if (wVar30 <= wVar25) {
            wVar22 = wVar30;
            do {
              make_inner_chamber_wall(c,wVar22,wVar15);
              make_inner_chamber_wall(c,wVar22,wVar21);
              wVar22 = wVar22 + L'\x01';
            } while (wVar25 + L'\x01' != wVar22);
          }
          iVar24 = wVar21 - wVar15;
          if (wVar15 <= wVar21) {
            wVar22 = wVar15;
            do {
              make_inner_chamber_wall(c,wVar30,wVar22);
              make_inner_chamber_wall(c,wVar25,wVar22);
              wVar22 = wVar22 + L'\x01';
            } while (wVar21 + L'\x01' != wVar22);
          }
          iVar9 = -iVar24;
          if (0 < iVar24) {
            iVar9 = iVar24;
          }
          iVar24 = -iVar20;
          if (0 < iVar20) {
            iVar24 = iVar20;
          }
          local_80 = iVar24 + 1;
          iVar20 = 0;
          do {
            uVar5 = Rand_div(2);
            uVar8 = Rand_div(2);
            if (uVar5 == 0) {
              wVar22 = wVar21;
              if (uVar8 == 0) {
                wVar22 = wVar15;
              }
              uVar5 = Rand_div(local_80);
              wVar26 = uVar5 + wVar30;
            }
            else {
              wVar26 = wVar25;
              if (uVar8 == 0) {
                wVar26 = wVar30;
              }
              uVar5 = Rand_div(iVar9 + 1);
              wVar22 = uVar5 + wVar15;
            }
            lVar10 = (loc)loc(wVar22,wVar26);
            _Var2 = square_iswall_inner((chunk_conflict *)c,lVar10);
            if (_Var2) {
              lVar10 = (loc)loc(wVar22,wVar26);
              _Var2 = square_in_bounds_fully((chunk_conflict *)c,lVar10);
              if (_Var2) {
                y = wVar26 + (int)local_60;
                iVar24 = wVar22 + (int)local_68;
                lVar10 = (loc)loc(iVar24,y);
                psVar11 = square((chunk_conflict *)c,lVar10);
                if (FEAT_OPEN != (uint)psVar11->feat) {
                  uVar17 = 0;
                  lVar18 = 0;
                  do {
                    lVar10 = (loc)loc(iVar24,y);
                    _Var2 = square_iswall_inner((chunk_conflict *)c,lVar10);
                    uVar17 = _Var2 + uVar17;
                    if (3 < uVar17) break;
                    if (lVar18 == 8) {
                      lVar10 = (loc)loc(wVar22,wVar26);
                      square_set_feat((chunk_conflict *)c,lVar10,FEAT_OPEN);
                      goto LAB_0015804c;
                    }
                    y = ddy_ddd[lVar18 + 1] + wVar26;
                    iVar24 = ddx_ddd[lVar18 + 1] + wVar22;
                    lVar10 = (loc)loc(iVar24,y);
                    psVar11 = square((chunk_conflict *)c,lVar10);
                    lVar18 = lVar18 + 1;
                  } while (FEAT_OPEN != (uint)psVar11->feat);
                }
              }
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 != 0x14);
LAB_0015804c:
          uVar17 = local_84 + 1;
        } while (uVar17 < (uint)local_70);
        wVar25 = y1;
        if (y1 <= wVar16) {
          do {
            if (x1 <= x2) {
              uVar19 = uVar27;
              do {
                lVar10 = (loc)(uVar19 | (ulong)(uint)wVar25 << 0x20);
                _Var2 = square_in_bounds_fully((chunk_conflict *)c,lVar10);
                wVar15 = (wchar_t)uVar19;
                if (_Var2) {
                  lVar18 = 0;
                  iVar20 = 0;
                  do {
                    lVar12 = (loc)loc_sum((loc_conflict)lVar10,(loc_conflict)ddgrid_ddd[lVar18]);
                    psVar11 = square((chunk_conflict *)c,lVar12);
                    if ((FEAT_GRANITE == (uint)psVar11->feat) &&
                       (_Var2 = square_iswall_outer((chunk_conflict *)c,lVar12), !_Var2)) {
                      _Var2 = square_iswall_solid((chunk_conflict *)c,lVar12);
                      iVar20 = iVar20 + (uint)!_Var2;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 8);
                  if (iVar20 == 5) {
                    psVar11 = square((chunk_conflict *)c,lVar10);
                    if (FEAT_MAGMA != (uint)psVar11->feat) {
LAB_00158160:
                      square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
                      generate_mark(c,wVar25,wVar15,wVar25,wVar15,L'\v');
                    }
                  }
                  else if (5 < iVar20) goto LAB_00158160;
                }
                uVar19 = (ulong)(uint)(wVar15 + L'\x01');
              } while (wVar15 != x2);
            }
            bVar31 = wVar25 != wVar16;
            wVar25 = wVar25 + L'\x01';
          } while (bVar31);
        }
        uVar7 = local_90 >> 2;
        uVar17 = local_90 >> 1;
        iVar20 = 0x31;
        do {
          uVar5 = Rand_div(uVar6 >> 1);
          uVar8 = Rand_div(uVar17);
          lVar10 = (loc)loc(uVar5 + (uVar6 >> 2) + x1,uVar8 + uVar7 + y1);
          psVar11 = square((chunk_conflict *)c,lVar10);
          bVar31 = iVar20 != 0;
          iVar20 = iVar20 + -1;
          if (FEAT_MAGMA == (uint)psVar11->feat) break;
        } while (bVar31);
        square_set_feat((chunk_conflict *)c,lVar10,FEAT_FLOOR);
        hollow_out_room(c,(loc_conflict)lVar10);
        iVar20 = 0;
        do {
          if (wVar16 <= y1) break;
          bVar1 = 0;
          wVar25 = y1;
          do {
            if (x1 < x2) {
              uVar19 = uVar27;
              do {
                lVar10 = (loc)(uVar19 | (ulong)(uint)wVar25 << 0x20);
                psVar11 = square((chunk_conflict *)c,lVar10);
                if ((FEAT_MAGMA == (uint)psVar11->feat) &&
                   (_Var2 = square_in_bounds_fully((chunk_conflict *)c,lVar10), _Var2)) {
                  lVar18 = 0;
                  do {
                    lVar12 = ddgrid_ddd[lVar18];
                    grid = (loc)loc_sum((loc_conflict)lVar10,(loc_conflict)lVar12);
                    _Var2 = square_iswall_inner((chunk_conflict *)c,grid);
                    if (_Var2) {
                      grid_00 = (loc)loc_sum((loc_conflict)grid,(loc_conflict)lVar12);
                      _Var2 = square_in_bounds((chunk_conflict *)c,grid_00);
                      if (_Var2) {
                        psVar11 = square((chunk_conflict *)c,grid_00);
                        if (FEAT_FLOOR == (uint)psVar11->feat) {
                          pwVar13 = &FEAT_BROKEN;
LAB_00158399:
                          square_set_feat((chunk_conflict *)c,grid,*pwVar13);
                          square_set_feat((chunk_conflict *)c,lVar10,FEAT_FLOOR);
                          hollow_out_room(c,(loc_conflict)lVar10);
                          bVar1 = 1;
                          break;
                        }
                        _Var2 = square_iswall_inner((chunk_conflict *)c,grid_00);
                        if (_Var2) {
                          lVar12 = (loc)loc_sum((loc_conflict)grid_00,(loc_conflict)lVar12);
                          _Var2 = square_in_bounds((chunk_conflict *)c,lVar12);
                          if (_Var2) {
                            psVar11 = square((chunk_conflict *)c,lVar12);
                            if (FEAT_FLOOR == (uint)psVar11->feat) {
                              square_set_feat((chunk_conflict *)c,grid,(uint)psVar11->feat);
                              pwVar13 = &FEAT_FLOOR;
                              grid = grid_00;
                              goto LAB_00158399;
                            }
                          }
                        }
                      }
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 4);
                }
                wVar15 = (int)uVar19 + L'\x01';
                uVar19 = (ulong)(uint)wVar15;
              } while (wVar15 != x2);
            }
            wVar25 = wVar25 + L'\x01';
          } while (wVar25 != wVar16);
          iVar20 = iVar20 + 1;
        } while ((bool)(bVar1 & iVar20 != 100));
        if (y1 <= wVar16) {
          wVar25 = y1;
          do {
            if (x1 <= x2) {
              uVar19 = uVar27;
              iVar20 = iVar28 + wVar29 / 2 + 1;
              do {
                wVar15 = (wchar_t)uVar19;
                lVar10 = (loc)(uVar19 | (ulong)(uint)wVar25 << 0x20);
                psVar11 = square((chunk_conflict *)c,lVar10);
                if (FEAT_OPEN == (uint)psVar11->feat) {
                  square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
                  generate_mark(c,wVar25,wVar15,wVar25,wVar15,L'\v');
                }
                else {
                  psVar11 = square((chunk_conflict *)c,lVar10);
                  if (FEAT_BROKEN == (uint)psVar11->feat) {
                    place_random_door((chunk_conflict *)c,(loc_conflict)lVar10);
                  }
                }
                uVar19 = (ulong)(uint)(wVar15 + L'\x01');
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            bVar31 = wVar25 != wVar16;
            wVar25 = wVar25 + L'\x01';
          } while (bVar31);
        }
        wVar29 = L'\x01';
        if (L'\x01' < y1) {
          wVar29 = y1;
        }
        wVar30 = wVar29 + L'\xffffffff';
        wVar21 = wVar16 + L'\x02';
        wVar25 = c->height;
        wVar15 = wVar25;
        if (wVar21 < wVar25) {
          wVar15 = wVar21;
        }
        if (wVar29 <= wVar15) {
          wVar22 = L'\x01';
          if (L'\x01' < x1) {
            wVar22 = x1;
          }
          wVar14 = x2 + L'\x02';
          wVar26 = c->width;
          wVar23 = wVar30;
          do {
            wVar15 = wVar26;
            if (wVar14 < wVar26) {
              wVar15 = wVar14;
            }
            if (wVar22 <= wVar15) {
              uVar27 = (ulong)(uint)(wVar22 + L'\xffffffff');
              do {
                lVar10 = (loc)((ulong)(uint)wVar23 << 0x20 | uVar27);
                _Var2 = square_iswall_inner((chunk_conflict *)c,lVar10);
                if ((_Var2) ||
                   (psVar11 = square((chunk_conflict *)c,lVar10), FEAT_MAGMA == (uint)psVar11->feat)
                   ) {
                  lVar18 = 0;
                  do {
                    lVar12 = (loc)loc_sum((loc_conflict)lVar10,(loc_conflict)ddgrid_ddd[lVar18]);
                    _Var2 = square_in_bounds((chunk_conflict *)c,lVar12);
                    if (_Var2) {
                      psVar11 = square((chunk_conflict *)c,lVar12);
                      if (FEAT_FLOOR == (uint)psVar11->feat) break;
                      if (lVar18 == 8) {
                        square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
                        break;
                      }
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 9);
                }
                _Var2 = square_isfloor((chunk_conflict *)c,lVar10);
                if (_Var2) {
                  lVar18 = 0;
                  do {
                    lVar12 = (loc)loc_sum((loc_conflict)lVar10,(loc_conflict)ddgrid_ddd[lVar18]);
                    _Var2 = square_in_bounds((chunk_conflict *)c,lVar12);
                    if (_Var2) {
                      psVar11 = square((chunk_conflict *)c,lVar12);
                      flag_on_dbg(psVar11->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                      psVar11 = square((chunk_conflict *)c,lVar12);
                      flag_on_dbg(psVar11->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                      if (local_7c < wVar4) {
                        psVar11 = square((chunk_conflict *)c,lVar12);
                        flag_on_dbg(psVar11->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                      }
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 9);
                }
                uVar27 = uVar27 + 1;
                wVar26 = c->width;
                wVar25 = wVar26;
                if (wVar14 < wVar26) {
                  wVar25 = wVar14;
                }
              } while ((wchar_t)uVar27 < wVar25);
              wVar25 = c->height;
            }
            wVar23 = wVar23 + L'\x01';
            wVar15 = wVar25;
            if (wVar21 < wVar25) {
              wVar15 = wVar21;
            }
          } while (wVar23 < wVar15);
        }
        iVar28 = (int)local_78;
        if (wVar29 <= wVar15) {
          wVar4 = L'\x01';
          if (L'\x01' < x1) {
            wVar4 = x1;
          }
          wVar15 = x2 + L'\x02';
          wVar29 = c->width;
          uVar27 = local_78;
          do {
            wVar22 = wVar29;
            if (wVar15 < wVar29) {
              wVar22 = wVar15;
            }
            if (wVar4 <= wVar22) {
              uVar27 = (ulong)(uint)(wVar4 + L'\xffffffff');
              do {
                lVar10 = (loc)((ulong)(uint)wVar30 << 0x20 | uVar27);
                _Var2 = square_in_bounds_fully((chunk_conflict *)c,lVar10);
                if ((_Var2) && (_Var2 = square_iswall_inner((chunk_conflict *)c,lVar10), _Var2)) {
                  lVar18 = 0;
                  do {
                    lVar12 = (loc)loc_sum((loc_conflict)lVar10,(loc_conflict)ddgrid_ddd[lVar18]);
                    psVar11 = square((chunk_conflict *)c,lVar12);
                    if ((((FEAT_GRANITE == (uint)psVar11->feat) &&
                         (_Var2 = square_iswall_inner((chunk_conflict *)c,lVar10), !_Var2)) &&
                        (_Var2 = square_iswall_outer((chunk_conflict *)c,lVar10), !_Var2)) &&
                       (_Var2 = square_iswall_solid((chunk_conflict *)c,lVar10), !_Var2)) {
                      square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
                      generate_mark(c,wVar30,(wchar_t)uVar27,wVar30,(wchar_t)uVar27,L'\f');
                      break;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 9);
                }
                uVar27 = uVar27 + 1;
                wVar29 = c->width;
                wVar25 = wVar29;
                if (wVar15 < wVar29) {
                  wVar25 = wVar15;
                }
              } while ((wchar_t)uVar27 < wVar25);
              wVar25 = c->height;
              uVar27 = local_78;
            }
            iVar28 = (int)uVar27;
            wVar30 = wVar30 + L'\x01';
            wVar22 = wVar25;
            if (wVar21 < wVar25) {
              wVar22 = wVar21;
            }
          } while (wVar30 < wVar22);
        }
        name_00 = local_58;
        get_chamber_monsters(c,y1,x1,wVar16,x2,name_00,iVar28 * h);
        add_to_monster_rating(c,10);
        uVar17 = 1;
        if ((player->opts).opt[0x18] == true) {
          if (local_58[0] == '\0') {
            name_00 = "empty";
          }
          msg("Room of chambers (%s)",name_00);
        }
      }
      goto LAB_00158968;
    }
  }
  else {
    _Var2 = find_space(&local_98,h,wVar29);
    if (_Var2) {
      centre = (loc_conflict)((ulong)local_98 & 0xffffffff);
      wVar16 = local_98.y;
      goto LAB_00157c08;
    }
  }
  uVar17 = 0;
LAB_00158968:
  return SUB41(uVar17,0);
}

Assistant:

bool build_room_of_chambers(struct chunk *c, struct loc centre, int rating)
{
	int i, d;
	int area, num_chambers;
	int y1, x1, y2, x2;
	struct loc grid;
	int height, width, count;

	char name[40];

	/* Deeper in the dungeon, chambers are less likely to be lit. */
	bool light = (randint0(45) > c->depth) ? true : false;

	/* Calculate a level-dependent room size. */
	height = 20 + m_bonus(20, c->depth);
	width = 20 + randint1(20) + m_bonus(20, c->depth);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Calculate the borders of the room. */
	y1 = centre.y - (height / 2);
	x1 = centre.x - (width / 2);
	y2 = centre.y + (height - 1) / 2;
	x2 = centre.x + (width - 1) / 2;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) || 
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Determine how much space we have. */
	area = ABS(y2 - y1) * ABS(x2 - x1);

	/* Calculate the number of smaller chambers to make. */
	num_chambers = 10 + area / 80;

	/* Build the chambers. */
	for (i = 0; i < num_chambers; i++) {
		int c_y1, c_x1, c_y2, c_x2;
		int size, width_local, height_local;

		/* Determine size of chamber. */
		size = 3 + randint0(4);
		width_local = size + randint0(10);
		height_local = size + randint0(4);

		/* Pick an upper-left corner at random. */
		c_y1 = y1 + randint0(1 + y2 - y1 - height_local);
		c_x1 = x1 + randint0(1 + x2 - x1 - width_local);

		/* Determine lower-right corner of chamber. */
		c_y2 = c_y1 + height_local;
		if (c_y2 > y2) c_y2 = y2;

		c_x2 = c_x1 + width_local;
		if (c_x2 > x2) c_x2 = x2;

		/* Make me a (magma filled) chamber. */
		make_chamber(c, c_y1, c_x1, c_y2, c_x2);
	}

	/* Remove useless doors, fill in tiny, narrow rooms. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			count = 0;

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid))
				continue;

			/* Check all adjacent grids. */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

				/* Count the walls and dungeon granite. */
				if ((square(c, grid1)->feat == FEAT_GRANITE) &&
					(!square_iswall_outer(c, grid1)) &&
					(!square_iswall_solid(c, grid1)))
					count++;
			}

			/* Five adjacent walls: Change non-chamber to wall. */
			if ((count == 5) && (square(c, grid)->feat != FEAT_MAGMA))
				set_marked_granite(c, grid, SQUARE_WALL_INNER);

			/* More than five adjacent walls: Change anything to wall. */
			else if (count > 5)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
		}
	}

	/* Pick a random magma spot near the center of the room. */
	for (i = 0; i < 50; i++) {
		grid = loc(x1 + ABS(x2 - x1) / 4 + randint0(ABS(x2 - x1) / 2),
				   y1 + ABS(y2 - y1) / 4 + randint0(ABS(y2 - y1) / 2));
		if (square(c, grid)->feat == FEAT_MAGMA)
			break;
	}

	/* Hollow out the first room. */
	square_set_feat(c, grid, FEAT_FLOOR);
	hollow_out_room(c, grid);

	/* Attempt to change every in-room magma grid to open floor. */
	for (i = 0; i < 100; i++) {
		/* Assume this run will do no useful work. */
		bool joy = false;

		/* Make new doors and tunnels between magma and open floor. */
		for (grid.y = y1; grid.y < y2; grid.y++) {
			for (grid.x = x1; grid.x < x2; grid.x++) {
				/* Current grid must be magma. */
				if (square(c, grid)->feat != FEAT_MAGMA) continue;

				/* Stay legal. */
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Check only horizontal and vertical directions. */
				for (d = 0; d < 4; d++) {
					struct loc grid1, grid2;

					/* Extract adjacent location */
					grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Need inner wall. */
					if (!square_iswall_inner(c, grid1)) 
						continue;

					/* Keep going in the same direction, if in bounds. */
					grid2 = loc_sum(grid1, ddgrid_ddd[d]);
					if (!square_in_bounds(c, grid2)) continue;

					/* If we find open floor, place a door. */
					if (square(c, grid2)->feat == FEAT_FLOOR) {
						joy = true;

						/* Make a broken door in the wall grid. */
						square_set_feat(c, grid1, FEAT_BROKEN);

						/* Hollow out the new room. */
						square_set_feat(c, grid, FEAT_FLOOR);
						hollow_out_room(c, grid);

						break;
					}

					/* If we find more inner wall... */
					if (square_iswall_inner(c, grid2)) {
						/* ...Keep going in the same direction. */
						struct loc grid3 = loc_sum(grid2, ddgrid_ddd[d]);
						if (!square_in_bounds(c, grid3)) continue;

						/* If we /now/ find floor, make a tunnel. */
						if (square(c, grid3)->feat == FEAT_FLOOR) {
							joy = true;

							/* Turn both wall grids into floor. */
							square_set_feat(c, grid1, FEAT_FLOOR);
							square_set_feat(c, grid2, FEAT_FLOOR);

							/* Hollow out the new room. */
							square_set_feat(c, grid, FEAT_FLOOR);
							hollow_out_room(c, grid);

							break;
						}
					}
				}
			}
		}

		/* If we could find no work to do, stop. */
		if (!joy) break;
	}


	/* Turn broken doors into a random kind of door, remove open doors. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			if (square(c, grid)->feat == FEAT_OPEN)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
			else if (square(c, grid)->feat == FEAT_BROKEN)
				place_random_door(c, grid);
		}
	}


	/* Turn all walls and magma not adjacent to floor into dungeon granite. */
	/* Turn all floors and adjacent grids into rooms, sometimes lighting them */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			if (square_iswall_inner(c, grid)
				|| (square(c, grid)->feat == FEAT_MAGMA)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* No floors allowed */
					if (square(c, grid1)->feat == FEAT_FLOOR) break;

					/* Turn me into dungeon granite. */
					if (d == 8)
						set_marked_granite(c, grid, SQUARE_NONE);
				}
			}
			if (square_isfloor(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* Turn into room, forbid stairs. */
					sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
					sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

					/* Illuminate if requested. */
					if (light) sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);
				}
			}
		}
	}


	/* Turn all inner wall grids adjacent to dungeon granite into outer walls */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid)) continue;

			if (square_iswall_inner(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Look for dungeon granite */
					if ((square(c, grid1)->feat == FEAT_GRANITE) && 
						(!square_iswall_inner(c, grid)) &&
						(!square_iswall_outer(c, grid)) &&
						(!square_iswall_solid(c, grid)))
					{
						/* Turn me into outer wall. */
						set_marked_granite(c, grid, SQUARE_WALL_OUTER);

						/* Done; */
						break;
					}
				}
			}
		}
	}

	/*** Now we get to place the monsters. ***/
	get_chamber_monsters(c, y1, x1, y2, x2, name, height * width);

	/* Increase the level rating */
	add_to_monster_rating(c, 10);

	/* Describe */
	ROOM_LOG("Room of chambers (%s)", strlen(name) ? name : "empty");

	/* Success. */
	return (true);
}